

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O1

void Dar_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  int v;
  unsigned_short uVar13;
  ulong uVar14;
  
  __ptr = (unsigned_short *)calloc(0x10000,2);
  uVar14 = 1;
  __ptr_00 = (char *)calloc(0x10000,1);
  __ptr_01 = (char *)calloc(0x10000,1);
  __ptr_02 = (uchar *)calloc(0x10000,1);
  __ptr_03 = Dar_Permutations(4);
  iVar11 = 1;
  do {
    uVar5 = (ulong)__ptr[uVar14];
    if (uVar5 == 0) {
      iVar8 = iVar11 + 1;
      __ptr_02[uVar14] = (uchar)iVar11;
      uVar10 = 0;
      do {
        puVar12 = Dar_TruthPolarize::Signs;
        lVar9 = 0;
        uVar5 = uVar14 & 0xffffffff;
        do {
          if ((uVar10 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
            bVar6 = (byte)(1 << ((byte)lVar9 & 0x1f));
            uVar5 = (ulong)((*puVar12 & (uint)uVar5) >> (bVar6 & 0x1f) |
                           (~*puVar12 & (uint)uVar5) << (bVar6 & 0x1f));
          }
          lVar9 = lVar9 + 1;
          puVar12 = puVar12 + 1;
        } while (lVar9 != 4);
        bVar6 = (byte)uVar10;
        lVar9 = 0;
        do {
          uVar2 = Dar_TruthPermute((uint)uVar5,__ptr_03[lVar9],4,0);
          uVar13 = (unsigned_short)uVar14;
          if ((ulong)__ptr[uVar2] == 0) {
            __ptr[uVar2] = uVar13;
            __ptr_00[uVar2] = bVar6;
            __ptr_01[uVar2] = (char)lVar9;
            __ptr_02[uVar2] = __ptr_02[uVar14];
            uVar4 = (ulong)(ushort)uVar2 ^ 0xffff;
            __ptr[uVar4] = uVar13;
            __ptr_00[uVar4] = bVar6 | 0x10;
            __ptr_01[uVar4] = (char)lVar9;
            __ptr_02[uVar4] = __ptr_02[uVar14];
          }
          else if (uVar14 != __ptr[uVar2]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darPrec.c"
                          ,0x155,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x18);
        puVar12 = Dar_TruthPolarize::Signs;
        lVar9 = 0;
        uVar2 = (uint)uVar14 ^ 0xffff;
        do {
          if ((uVar10 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
            bVar7 = (byte)(1 << ((byte)lVar9 & 0x1f));
            uVar2 = (*puVar12 & uVar2) >> (bVar7 & 0x1f) | (~*puVar12 & uVar2) << (bVar7 & 0x1f);
          }
          lVar9 = lVar9 + 1;
          puVar12 = puVar12 + 1;
        } while (lVar9 != 4);
        lVar9 = 0;
        do {
          uVar3 = Dar_TruthPermute(uVar2,__ptr_03[lVar9],4,0);
          if ((ulong)__ptr[uVar3] == 0) {
            __ptr[uVar3] = uVar13;
            __ptr_00[uVar3] = bVar6;
            __ptr_01[uVar3] = (char)lVar9;
            __ptr_02[uVar3] = __ptr_02[uVar14];
            uVar5 = (ulong)(ushort)uVar3 ^ 0xffff;
            __ptr[uVar5] = uVar13;
            __ptr_00[uVar5] = bVar6 | 0x10;
            __ptr_01[uVar5] = (char)lVar9;
            __ptr_02[uVar5] = __ptr_02[uVar14];
          }
          else if (uVar14 != __ptr[uVar3]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darPrec.c"
                          ,0x169,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x18);
        uVar10 = uVar10 + 1;
        iVar11 = iVar8;
      } while (uVar10 != 0x10);
    }
    else {
      if (uVar14 <= uVar5) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darPrec.c"
                      ,0x13c,
                      "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __ptr_02[uVar5];
      __ptr_02[uVar14] = uVar1;
      __ptr_02[uVar14 & 0xffffffff ^ 0xffff] = uVar1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x8000);
  lVar9 = 1;
  do {
    if (__ptr_02[lVar9] == '\0') {
      __assert_fail("uMap[uTruth] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darPrec.c"
                    ,0x16e,
                    "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xffff);
  __ptr_00[0xffff] = '\x10';
  if (iVar11 != 0xde) {
    __assert_fail("nClasses == 222",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darPrec.c"
                  ,0x170,
                  "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
  }
  if (__ptr_03 != (char **)0x0) {
    free(__ptr_03);
  }
  if (puCanons == (unsigned_short **)0x0) {
    if (__ptr != (unsigned_short *)0x0) {
      free(__ptr);
    }
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char **)0x0) {
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
    }
  }
  else {
    *puPhases = __ptr_00;
  }
  if (puPerms == (char **)0x0) {
    if (__ptr_01 != (char *)0x0) {
      free(__ptr_01);
    }
  }
  else {
    *puPerms = __ptr_01;
  }
  if (puMap == (uchar **)0x0) {
    if (__ptr_02 != (uchar *)0x0) {
      free(__ptr_02);
      return;
    }
  }
  else {
    *puMap = __ptr_02;
  }
  return;
}

Assistant:

void Dar_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_CALLOC( unsigned short, nFuncs );
    uPhases = ABC_CALLOC( char, nFuncs );
    uPerms  = ABC_CALLOC( char, nFuncs );
    uMap    = ABC_CALLOC( unsigned char, nFuncs );
    pPerms4 = Dar_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Dar_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Dar_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    for ( uTruth = 1; uTruth < 0xffff; uTruth++ )
        assert( uMap[uTruth] != 0 );
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}